

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

uint32_t mp_decode_extl(char **data,int8_t *type)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  
  pcVar2 = *data;
  cVar1 = *pcVar2;
  pcVar4 = pcVar2 + 1;
  *data = pcVar4;
  switch(cVar1) {
  case -0x39:
    uVar3 = (uint)(byte)pcVar2[1];
    pcVar4 = pcVar2 + 2;
    break;
  case -0x38:
    pcVar4 = pcVar2 + 3;
    uVar3 = (uint)(ushort)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
    break;
  case -0x37:
    uVar3 = *(uint *)(pcVar2 + 1);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    pcVar4 = pcVar2 + 5;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x6a1,"uint32_t mp_decode_extl(const char **, int8_t *)");
  case -0x2c:
  case -0x2b:
  case -0x2a:
  case -0x29:
  case -0x28:
    uVar3 = 1 << (cVar1 + 0x2cU & 0x1f);
  }
  cVar1 = *pcVar4;
  *data = pcVar4 + 1;
  *type = cVar1;
  return uVar3;
}

Assistant:

MP_IMPL uint32_t
mp_decode_extl(const char **data, int8_t *type) {
	uint8_t c = mp_load_u8(data);
	uint32_t len;
	switch 	 (c) {
	case 0xd4:
	case 0xd5:
	case 0xd6:
	case 0xd7:
	case 0xd8:
		len = 1u << (c - 0xd4);
		break;
	case 0xc7:
		len = mp_load_u8(data);
		break;
	case 0xc8:
		len = mp_load_u16(data);
		break;
	case 0xc9:
		len = mp_load_u32(data);
		break;
	default:
		mp_unreachable();
	}
	*type = mp_load_u8(data);
	return len;
}